

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

int Abs_ManExtendOneEval_rec(Vec_Ptr_t *vSimInfo,Aig_Man_t *p,Aig_Obj_t *pObj,int iFrame)

{
  uint Value;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Aig_Obj_t *pObj_00;
  
  Value = Abs_ManSimInfoGet(vSimInfo,pObj,iFrame);
  if (Value == 0) {
    if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
      iVar1 = Saig_ObjIsLo(p,pObj);
      if (iVar1 == 0) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                      ,0xa2,
                      "int Abs_ManExtendOneEval_rec(Vec_Ptr_t *, Aig_Man_t *, Aig_Obj_t *, int)");
      }
      pObj_00 = Saig_ObjLoToLi(p,pObj);
      Value = Abs_ManExtendOneEval_rec(vSimInfo,p,pObj_00,iFrame + -1);
    }
    else {
      uVar2 = Abs_ManExtendOneEval_rec
                        (vSimInfo,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame)
      ;
      Value = (uint)(uVar2 != 2) * 2 + 1;
      if (uVar2 == 1) {
        Value = 2;
      }
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        Value = uVar2;
      }
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((uVar2 & 7) != 3) {
        if ((uVar2 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                        ,0xaf,
                        "int Abs_ManExtendOneEval_rec(Vec_Ptr_t *, Aig_Man_t *, Aig_Obj_t *, int)");
        }
        if (Value == 1) {
          Value = 1;
        }
        else {
          uVar3 = Abs_ManExtendOneEval_rec
                            (vSimInfo,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
                             iFrame);
          uVar2 = (uint)(uVar3 != 2) * 2 + 1;
          if (uVar3 == 1) {
            uVar2 = 2;
          }
          if (((ulong)pObj->pFanin1 & 1) == 0) {
            uVar2 = uVar3;
          }
          Value = (uVar2 == 2 && Value == 2) ^ 3;
          if (uVar2 == 1) {
            Value = 1;
          }
        }
      }
    }
    Abs_ManSimInfoSet(vSimInfo,pObj,iFrame,Value);
  }
  return Value;
}

Assistant:

int Abs_ManExtendOneEval_rec( Vec_Ptr_t * vSimInfo, Aig_Man_t * p, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value = Abs_ManSimInfoGet( vSimInfo, pObj, iFrame );
    if ( Value )
        return Value;
    if ( Aig_ObjIsCi(pObj) )
    {
        assert( Saig_ObjIsLo(p, pObj) );
        Value = Abs_ManExtendOneEval_rec( vSimInfo, p, Saig_ObjLoToLi(p, pObj), iFrame-1 );
        Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
        return Value;
    }
    Value0 = Abs_ManExtendOneEval_rec( vSimInfo, p, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Abs_ManSimInfoNot( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( Value0 == ABS_ZER )
        Value = ABS_ZER;
    else
    {
        Value1 = Abs_ManExtendOneEval_rec( vSimInfo, p, Aig_ObjFanin1(pObj), iFrame );
        if ( Aig_ObjFaninC1(pObj) )
            Value1 = Abs_ManSimInfoNot( Value1 );
        Value = Abs_ManSimInfoAnd( Value0, Value1 );
    }
    Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
    assert( Value );
    return Value;
}